

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_pack8to1_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,int kernel_w,int kernel_h,int dilation_w,
               int dilation_h,int stride_w,int stride_h,Option *opt)

{
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000020;
  int j;
  int i;
  int64_t *sptr;
  int v;
  int u;
  int64_t *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_000009e8;
  Mat *in_stack_000009f0;
  Mat *in_stack_000009f8;
  Mat *in_stack_00000a00;
  undefined8 in_stack_fffffffffffffc70;
  void **ppvVar1;
  size_t in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  Mat *in_stack_fffffffffffffc90;
  int local_338;
  int local_334;
  undefined8 *local_330;
  int local_328;
  int local_324;
  undefined8 local_320;
  undefined8 local_318;
  Allocator *in_stack_fffffffffffffcf0;
  undefined8 *local_2d8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  long local_2a0;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined8 local_280;
  int local_278;
  int local_274;
  void *local_270;
  int *local_268;
  long local_260;
  undefined4 local_258;
  long *local_250;
  undefined4 local_248;
  int local_244;
  int local_240;
  undefined4 local_23c;
  undefined4 local_238;
  long local_230;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  long *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  void **local_1d0;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  undefined8 *local_188;
  undefined8 *local_178;
  undefined1 local_16d;
  int local_16c;
  void **local_168;
  undefined8 *local_160;
  undefined1 local_13d;
  int local_13c;
  undefined8 *local_130;
  void *local_e8;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  long local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  long *local_a0;
  undefined4 local_94;
  long local_90;
  undefined8 *local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  undefined4 local_64;
  long local_60;
  undefined4 local_54;
  long local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined4 local_34;
  undefined8 local_30;
  int local_24;
  int local_20;
  int local_1c;
  void **local_18;
  int local_c;
  undefined8 *local_8;
  
  local_210 = *(int *)((long)in_RDI + 0x2c);
  local_214 = (int)in_RDI[7];
  local_218 = *(int *)(in_RSI + 0x2c);
  local_21c = *(int *)(in_RSI + 0x30);
  local_220 = local_218 * local_21c;
  local_224 = in_ECX * in_R8D;
  local_40 = *(undefined8 *)(in_stack_00000020 + 0x10);
  local_18 = &local_270;
  local_30 = 8;
  local_34 = 8;
  local_270 = (void *)0x0;
  local_268 = (int *)0x0;
  local_260 = 0;
  local_258 = 0;
  local_250 = (long *)0x0;
  local_248 = 0;
  local_244 = 0;
  local_240 = 0;
  local_23c = 0;
  local_238 = 0;
  local_230 = 0;
  local_20c = in_R9D;
  local_208 = in_R8D;
  local_204 = in_ECX;
  local_1f0 = in_RDI;
  local_24 = local_214;
  local_20 = local_224;
  local_1c = local_220;
  Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
              (int)in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20),
              in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
              in_stack_fffffffffffffcf0);
  local_274 = local_210 * in_stack_00000018 - local_218 * in_stack_00000010;
  for (local_278 = 0; local_278 < local_214; local_278 = local_278 + 1) {
    local_130 = &local_2c0;
    local_ac = *(int *)((long)local_1f0 + 0x2c);
    local_b0 = (int)local_1f0[6];
    local_b4 = *(undefined4 *)((long)local_1f0 + 0x34);
    local_c0 = *local_1f0 + local_1f0[8] * (long)local_278 * local_1f0[2];
    local_c8 = local_1f0[2];
    local_cc = (undefined4)local_1f0[3];
    local_d8 = local_1f0[4];
    local_a8 = &local_2c0;
    local_50 = (long)local_ac * (long)local_b0 * local_c8;
    local_160 = &local_320;
    local_168 = &local_270;
    local_88 = (undefined8 *)((long)local_270 + local_230 * local_278 * local_260);
    local_70 = &local_320;
    local_60 = (long)local_244 * (long)local_240 * local_260;
    local_48 = &local_320;
    local_1e8 = &local_320;
    local_320 = 0;
    local_318 = 0;
    local_2d8 = local_88;
    for (local_324 = 0; local_324 < local_208; local_324 = local_324 + 1) {
      for (local_328 = 0; local_328 < local_204; local_328 = local_328 + 1) {
        local_c = in_stack_00000008 * local_324;
        local_8 = &local_2c0;
        local_330 = (undefined8 *)
                    (local_c0 + (long)local_ac * (long)local_c * local_c8 +
                    (long)(local_20c * local_328) * 8);
        for (local_334 = 0; local_334 < local_21c; local_334 = local_334 + 1) {
          for (local_338 = 0; local_338 < local_218; local_338 = local_338 + 1) {
            *local_2d8 = *local_330;
            local_330 = local_330 + in_stack_00000010;
            local_2d8 = local_2d8 + 1;
          }
          local_330 = local_330 + local_274;
        }
      }
    }
    local_1e0 = &local_2c0;
    local_54 = 0x10;
    local_64 = 0x10;
    local_74 = local_244;
    local_78 = local_240;
    local_7c = local_23c;
    local_90 = local_260;
    local_94 = local_258;
    local_a0 = local_250;
    local_13c = local_278;
    local_13d = 1;
    local_16c = local_278;
    local_16d = 1;
    local_2c0 = 0;
    local_2b0 = 0;
    local_2a8 = 0;
    local_298 = 0;
    local_294 = 0;
    local_290 = 0;
    local_28c = 0;
    local_288 = 0;
    local_280 = 0;
    local_2b8 = 0;
    local_188 = local_1e0;
    local_178 = local_1e8;
    local_2a0 = local_d8;
  }
  im2col_sgemm_pack8to1_int8_sse
            (in_stack_00000a00,in_stack_000009f8,in_stack_000009f0,in_stack_000009e8);
  ppvVar1 = &local_270;
  if (local_268 != (int *)0x0) {
    local_1ac = 0xffffffff;
    LOCK();
    local_1b0 = *local_268;
    *local_268 = *local_268 + -1;
    UNLOCK();
    if (local_1b0 == 1) {
      local_1d0 = ppvVar1;
      local_1a8 = ppvVar1;
      if (local_250 == (long *)0x0) {
        local_e8 = local_270;
        if (local_270 != (void *)0x0) {
          free(local_270);
        }
      }
      else {
        (**(code **)(*local_250 + 0x18))(local_250,local_270);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);
    {
        const int gap = w * stride_h - outw * stride_w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            int64_t* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const int64_t* sptr = img.row<const int64_t>(dilation_h * u) + dilation_w * v;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            ptr[0] = sptr[0];

                            sptr += stride_w;
                            ptr += 1;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}